

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_block_error_intrin_sse2.c
# Opt level: O0

int64_t av1_highbd_block_error_sse2
                  (tran_low_t *coeff,tran_low_t *dqcoeff,intptr_t block_size,int64_t *ssz,int bps)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 auVar5 [16];
  byte bVar6;
  int iVar7;
  long lVar8;
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  char in_R8B;
  ulong uVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int rounding;
  int shift;
  int64_t sqcoeff;
  int64_t error;
  __m128i cmp3;
  __m128i cmp2;
  __m128i cmp1;
  __m128i cmp0;
  __m128i min;
  __m128i max;
  uint32_t temp [4];
  int test;
  int j;
  int i;
  ulong local_4e8;
  ulong uStack_4e0;
  long local_478;
  long local_470;
  int local_408;
  uint uStack_404;
  int iStack_400;
  uint uStack_3fc;
  int local_3ec;
  int local_3e8;
  int local_308;
  int iStack_304;
  int iStack_300;
  int iStack_2fc;
  int local_2e8;
  int iStack_2e4;
  int iStack_2e0;
  int iStack_2dc;
  int local_2c8;
  int iStack_2c4;
  int iStack_2c0;
  int iStack_2bc;
  int local_2a8;
  int iStack_2a4;
  int iStack_2a0;
  int iStack_29c;
  short local_e8;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  short sStack_da;
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  int64_t diff;
  __m128i sqcoeff_sse2;
  __m128i error_sse2;
  __m128i mm_diff;
  __m128i mm_dqcoeff2;
  __m128i mm_dqcoeff;
  __m128i mm_coeff2;
  __m128i mm_coeff;
  
  local_470 = 0;
  local_478 = 0;
  bVar6 = (in_R8B + -8) * '\x02';
  iVar7 = (1 << (bVar6 & 0x1f)) >> 1;
  for (local_3e8 = 0; local_3e8 < in_RDX; local_3e8 = local_3e8 + 8) {
    pauVar1 = (undefined1 (*) [16])(in_RDI + (long)local_3e8 * 4);
    pauVar3 = (undefined1 (*) [16])(in_RDI + 0x10 + (long)local_3e8 * 4);
    pauVar2 = (undefined1 (*) [16])(in_RSI + (long)local_3e8 * 4);
    pauVar4 = (undefined1 (*) [16])(in_RSI + 0x10 + (long)local_3e8 * 4);
    local_2a8 = (int)*(undefined8 *)*pauVar1;
    iStack_2a4 = (int)((ulong)*(undefined8 *)*pauVar1 >> 0x20);
    iStack_2a0 = (int)*(undefined8 *)(*pauVar1 + 8);
    iStack_29c = (int)((ulong)*(undefined8 *)(*pauVar1 + 8) >> 0x20);
    local_2c8 = (int)*(undefined8 *)*pauVar3;
    iStack_2c4 = (int)((ulong)*(undefined8 *)*pauVar3 >> 0x20);
    iStack_2c0 = (int)*(undefined8 *)(*pauVar3 + 8);
    iStack_2bc = (int)((ulong)*(undefined8 *)(*pauVar3 + 8) >> 0x20);
    local_2e8 = (int)*(undefined8 *)*pauVar2;
    iStack_2e4 = (int)((ulong)*(undefined8 *)*pauVar2 >> 0x20);
    iStack_2e0 = (int)*(undefined8 *)(*pauVar2 + 8);
    iStack_2dc = (int)((ulong)*(undefined8 *)(*pauVar2 + 8) >> 0x20);
    local_308 = (int)*(undefined8 *)*pauVar4;
    iStack_304 = (int)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
    iStack_300 = (int)*(undefined8 *)(*pauVar4 + 8);
    iStack_2fc = (int)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
    uVar11 = CONCAT44(-(uint)(0x3fff < iStack_29c),-(uint)(0x3fff < iStack_2a0)) ^
             CONCAT44(-(uint)(iStack_29c < -0x4000),-(uint)(iStack_2a0 < -0x4000)) |
             CONCAT44(-(uint)(0x3fff < iStack_2bc),-(uint)(0x3fff < iStack_2c0)) ^
             CONCAT44(-(uint)(iStack_2bc < -0x4000),-(uint)(iStack_2c0 < -0x4000)) |
             CONCAT44(-(uint)(0x3fff < iStack_2dc),-(uint)(0x3fff < iStack_2e0)) ^
             CONCAT44(-(uint)(iStack_2dc < -0x4000),-(uint)(iStack_2e0 < -0x4000)) |
             CONCAT44(-(uint)(0x3fff < iStack_2fc),-(uint)(0x3fff < iStack_300)) ^
             CONCAT44(-(uint)(iStack_2fc < -0x4000),-(uint)(iStack_300 < -0x4000));
    auVar9._8_8_ = uVar11;
    auVar9._0_8_ = CONCAT44(-(uint)(0x3fff < iStack_2a4),-(uint)(0x3fff < local_2a8)) ^
                   CONCAT44(-(uint)(iStack_2a4 < -0x4000),-(uint)(local_2a8 < -0x4000)) |
                   CONCAT44(-(uint)(0x3fff < iStack_2c4),-(uint)(0x3fff < local_2c8)) ^
                   CONCAT44(-(uint)(iStack_2c4 < -0x4000),-(uint)(local_2c8 < -0x4000)) |
                   CONCAT44(-(uint)(0x3fff < iStack_2e4),-(uint)(0x3fff < local_2e8)) ^
                   CONCAT44(-(uint)(iStack_2e4 < -0x4000),-(uint)(local_2e8 < -0x4000)) |
                   CONCAT44(-(uint)(0x3fff < iStack_304),-(uint)(0x3fff < local_308)) ^
                   CONCAT44(-(uint)(iStack_304 < -0x4000),-(uint)(local_308 < -0x4000));
    if ((((((((((((((((auVar9 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar9 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar9 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar9 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar9 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar9 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar9 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar9 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (uVar11 >> 7 & 1) == 0) && (uVar11 >> 0xf & 1) == 0) && (uVar11 >> 0x17 & 1) == 0) &&
           (uVar11 >> 0x1f & 1) == 0) && (uVar11 >> 0x27 & 1) == 0) && (uVar11 >> 0x2f & 1) == 0) &&
        (uVar11 >> 0x37 & 1) == 0) && -1 < (long)uVar11) {
      auVar9 = packssdw(*pauVar1,*pauVar3);
      auVar10 = packssdw(*pauVar2,*pauVar4);
      local_d8 = auVar9._0_2_;
      sStack_d6 = auVar9._2_2_;
      sStack_d4 = auVar9._4_2_;
      sStack_d2 = auVar9._6_2_;
      sStack_d0 = auVar9._8_2_;
      sStack_ce = auVar9._10_2_;
      sStack_cc = auVar9._12_2_;
      sStack_ca = auVar9._14_2_;
      local_e8 = auVar10._0_2_;
      sStack_e6 = auVar10._2_2_;
      sStack_e4 = auVar10._4_2_;
      sStack_e2 = auVar10._6_2_;
      sStack_e0 = auVar10._8_2_;
      sStack_de = auVar10._10_2_;
      sStack_dc = auVar10._12_2_;
      sStack_da = auVar10._14_2_;
      auVar5._2_2_ = sStack_d6 - sStack_e6;
      auVar5._0_2_ = local_d8 - local_e8;
      auVar5._4_2_ = sStack_d4 - sStack_e4;
      auVar5._6_2_ = sStack_d2 - sStack_e2;
      auVar5._10_2_ = sStack_ce - sStack_de;
      auVar5._8_2_ = sStack_d0 - sStack_e0;
      auVar5._12_2_ = sStack_cc - sStack_dc;
      auVar5._14_2_ = sStack_ca - sStack_da;
      auVar10._2_2_ = sStack_d6 - sStack_e6;
      auVar10._0_2_ = local_d8 - local_e8;
      auVar10._4_2_ = sStack_d4 - sStack_e4;
      auVar10._6_2_ = sStack_d2 - sStack_e2;
      auVar10._10_2_ = sStack_ce - sStack_de;
      auVar10._8_2_ = sStack_d0 - sStack_e0;
      auVar10._12_2_ = sStack_cc - sStack_dc;
      auVar10._14_2_ = sStack_ca - sStack_da;
      auVar10 = pmaddwd(auVar5,auVar10);
      auVar9 = pmaddwd(auVar9,auVar9);
      local_4e8 = auVar10._0_8_;
      uStack_4e0 = auVar10._8_8_;
      uStack_404 = auVar10._4_4_;
      uStack_3fc = auVar10._12_4_;
      local_470 = local_470 + (local_4e8 & 0xffffffff) + (ulong)uStack_404 +
                  (uStack_4e0 & 0xffffffff) + (ulong)uStack_3fc;
      uStack_404 = auVar9._4_4_;
      local_408 = auVar9._0_4_;
      uStack_3fc = auVar9._12_4_;
      iStack_400 = auVar9._8_4_;
      local_478 = (ulong)(local_408 + uStack_404 + iStack_400 + uStack_3fc) + local_478;
    }
    else {
      for (local_3ec = 0; local_3ec < 8; local_3ec = local_3ec + 1) {
        lVar8 = (long)(*(int *)(in_RDI + (long)(local_3e8 + local_3ec) * 4) -
                      *(int *)(in_RSI + (long)(local_3e8 + local_3ec) * 4));
        local_470 = lVar8 * lVar8 + local_470;
        local_478 = (long)*(int *)(in_RDI + (long)(local_3e8 + local_3ec) * 4) *
                    (long)*(int *)(in_RDI + (long)(local_3e8 + local_3ec) * 4) + local_478;
      }
    }
  }
  *in_RCX = local_478 + iVar7 >> (bVar6 & 0x3f);
  return local_470 + iVar7 >> (bVar6 & 0x3f);
}

Assistant:

int64_t av1_highbd_block_error_sse2(const tran_low_t *coeff,
                                    const tran_low_t *dqcoeff,
                                    intptr_t block_size, int64_t *ssz,
                                    int bps) {
  int i, j, test;
  uint32_t temp[4];
  __m128i max, min, cmp0, cmp1, cmp2, cmp3;
  int64_t error = 0, sqcoeff = 0;
  const int shift = 2 * (bps - 8);
  const int rounding = (1 << shift) >> 1;

  for (i = 0; i < block_size; i += 8) {
    // Load the data into xmm registers
    __m128i mm_coeff = _mm_load_si128((__m128i *)(coeff + i));
    __m128i mm_coeff2 = _mm_load_si128((__m128i *)(coeff + i + 4));
    __m128i mm_dqcoeff = _mm_load_si128((__m128i *)(dqcoeff + i));
    __m128i mm_dqcoeff2 = _mm_load_si128((__m128i *)(dqcoeff + i + 4));
    // Check if any values require more than 15 bit
    max = _mm_set1_epi32(0x3fff);
    min = _mm_set1_epi32((int)0xffffc000);
    cmp0 = _mm_xor_si128(_mm_cmpgt_epi32(mm_coeff, max),
                         _mm_cmplt_epi32(mm_coeff, min));
    cmp1 = _mm_xor_si128(_mm_cmpgt_epi32(mm_coeff2, max),
                         _mm_cmplt_epi32(mm_coeff2, min));
    cmp2 = _mm_xor_si128(_mm_cmpgt_epi32(mm_dqcoeff, max),
                         _mm_cmplt_epi32(mm_dqcoeff, min));
    cmp3 = _mm_xor_si128(_mm_cmpgt_epi32(mm_dqcoeff2, max),
                         _mm_cmplt_epi32(mm_dqcoeff2, min));
    test = _mm_movemask_epi8(
        _mm_or_si128(_mm_or_si128(cmp0, cmp1), _mm_or_si128(cmp2, cmp3)));

    if (!test) {
      __m128i mm_diff, error_sse2, sqcoeff_sse2;
      mm_coeff = _mm_packs_epi32(mm_coeff, mm_coeff2);
      mm_dqcoeff = _mm_packs_epi32(mm_dqcoeff, mm_dqcoeff2);
      mm_diff = _mm_sub_epi16(mm_coeff, mm_dqcoeff);
      error_sse2 = _mm_madd_epi16(mm_diff, mm_diff);
      sqcoeff_sse2 = _mm_madd_epi16(mm_coeff, mm_coeff);
      _mm_storeu_si128((__m128i *)temp, error_sse2);
      error = error + temp[0] + temp[1] + temp[2] + temp[3];
      _mm_storeu_si128((__m128i *)temp, sqcoeff_sse2);
      sqcoeff += temp[0] + temp[1] + temp[2] + temp[3];
    } else {
      for (j = 0; j < 8; j++) {
        const int64_t diff = coeff[i + j] - dqcoeff[i + j];
        error += diff * diff;
        sqcoeff += (int64_t)coeff[i + j] * (int64_t)coeff[i + j];
      }
    }
  }
  error = (error + rounding) >> shift;
  sqcoeff = (sqcoeff + rounding) >> shift;

  *ssz = sqcoeff;
  return error;
}